

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O1

S2CellUnion * __thiscall
S2CellUnion::Intersection(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  bool bVar1;
  bool bVar2;
  S2LogMessage SStack_38;
  
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002c1838
  ;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetIntersection(&this->cell_ids_,&y->cell_ids_,&__return_storage_ptr__->cell_ids_);
  bVar1 = IsNormalized(__return_storage_ptr__);
  if (bVar1) {
    bVar2 = false;
  }
  else {
    bVar1 = IsNormalized(this);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = IsNormalized(y);
    }
  }
  if (bVar2 != false) {
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
               ,0x142,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,
               "Check failed: result.IsNormalized() || (!IsNormalized() && !y.IsNormalized()) ",0x4e
              );
    if (bVar2 != false) {
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Intersection(const S2CellUnion& y) const {
  S2CellUnion result;
  GetIntersection(cell_ids_, y.cell_ids_, &result.cell_ids_);
  // The output is normalized as long as at least one input is normalized.
  S2_DCHECK(result.IsNormalized() || (!IsNormalized() && !y.IsNormalized()));
  return result;
}